

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TOIDecPOMDPDiscrete.cpp
# Opt level: O1

void __thiscall TOIDecPOMDPDiscrete::SoftPrint_abi_cxx11_(TOIDecPOMDPDiscrete *this)

{
  long *in_RSI;
  
  SoftPrint_abi_cxx11_
            ((string *)this,(TOIDecPOMDPDiscrete *)((long)in_RSI + *(long *)(*in_RSI + -0x180)));
  return;
}

Assistant:

string TOIDecPOMDPDiscrete::SoftPrint() const
{
    stringstream ss;
    ss << TransitionObservationIndependentMADPDiscrete::SoftPrint();
    ss << DecPOMDP::SoftPrint();

    if(_m_initialized)
    {
        ss << "Reward model: " << endl;
        ss << _m_p_rModel->SoftPrint();
    }
    else
        throw E("TOIDecPOMDPDiscrete components (reward model) not initialized");

    return(ss.str());
}